

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threading_pthreads.cpp
# Opt level: O0

int __thiscall crnlib::task_pool::init(task_pool *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong extraout_RAX;
  int status;
  bool succeeded;
  uint num_threads_local;
  task_pool *this_local;
  
  uVar2 = math::minimum<unsigned_int>((uint)ctx,0x40);
  deinit(this);
  bVar1 = true;
  this->m_num_threads = 0;
  do {
    uVar3 = this->m_num_threads;
    if (uVar2 <= uVar3) {
LAB_0019eae0:
      uVar4 = (ulong)uVar3;
      if (!bVar1) {
        deinit(this);
        uVar4 = extraout_RAX;
      }
      return (int)CONCAT71((int7)(uVar4 >> 8),bVar1);
    }
    uVar3 = pthread_create(this->m_threads + this->m_num_threads,(pthread_attr_t *)0x0,thread_func,
                           this);
    if (uVar3 != 0) {
      bVar1 = false;
      goto LAB_0019eae0;
    }
    this->m_num_threads = this->m_num_threads + 1;
  } while( true );
}

Assistant:

bool task_pool::init(uint num_threads) {
  CRNLIB_ASSERT(num_threads <= cMaxThreads);
  num_threads = math::minimum<uint>(num_threads, cMaxThreads);

  deinit();

  bool succeeded = true;

  m_num_threads = 0;
  while (m_num_threads < num_threads) {
    int status = pthread_create(&m_threads[m_num_threads], NULL, thread_func, this);
    if (status) {
      succeeded = false;
      break;
    }

    m_num_threads++;
  }

  if (!succeeded) {
    deinit();
    return false;
  }

  return true;
}